

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_pubkey *pubkey,
              uint flags)

{
  ulong __n;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  size_t len;
  secp256k1_ge Q;
  
  if (outputlen == (size_t *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "outputlen != NULL";
  }
  else {
    __n = *outputlen;
    if (__n < (ulong)((flags & 0x100) == 0) * 0x20 + 0x21) {
      pvVar2 = (ctx->illegal_callback).data;
      pcVar3 = "*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33u : 65u)";
    }
    else {
      *outputlen = 0;
      len = __n;
      if (output == (uchar *)0x0) {
        pvVar2 = (ctx->illegal_callback).data;
        pcVar3 = "output != NULL";
      }
      else {
        memset(output,0,__n);
        if (pubkey == (secp256k1_pubkey *)0x0) {
          pvVar2 = (ctx->illegal_callback).data;
          pcVar3 = "pubkey != NULL";
        }
        else {
          if ((char)flags == '\x02') {
            iVar1 = secp256k1_pubkey_load(ctx,&Q,pubkey);
            if (iVar1 == 0) {
              return 0;
            }
            iVar1 = secp256k1_eckey_pubkey_serialize(&Q,output,&len,flags & 0x100);
            if (iVar1 == 0) {
              return 0;
            }
            *outputlen = len;
            return 1;
          }
          pvVar2 = (ctx->illegal_callback).data;
          pcVar3 = "(flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION";
        }
      }
    }
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_pubkey* pubkey, unsigned int flags) {
    secp256k1_ge Q;
    size_t len;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33u : 65u));
    len = *outputlen;
    *outputlen = 0;
    ARG_CHECK(output != NULL);
    memset(output, 0, len);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION);
    if (secp256k1_pubkey_load(ctx, &Q, pubkey)) {
        ret = secp256k1_eckey_pubkey_serialize(&Q, output, &len, flags & SECP256K1_FLAGS_BIT_COMPRESSION);
        if (ret) {
            *outputlen = len;
        }
    }
    return ret;
}